

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_scalar_umul128(uint16_t *in,uint32_t n,uint32_t *out)

{
  ushort *puVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar15 [32];
  
  auVar14._8_4_ = 0xfff;
  auVar14._0_8_ = 0xfff00000fff;
  auVar14._12_4_ = 0xfff;
  auVar15._16_4_ = 0xfff;
  auVar15._0_16_ = auVar14;
  auVar15._20_4_ = 0xfff;
  auVar15._24_4_ = 0xfff;
  auVar15._28_4_ = 0xfff;
  auVar2 = vpmovsxbq_avx2(ZEXT416(0x19262626));
  auVar11 = vpmovsxbq_avx512f(ZEXT816(0x30201000a0908));
  auVar16._8_8_ = 0x1249124912491249;
  auVar16._0_8_ = 0x1249124912491249;
  auVar17._8_8_ = 0x3801c00e007007;
  auVar17._0_8_ = 0x3801c00e007007;
  while( true ) {
    if (n < 4) break;
    auVar21 = ZEXT1664((undefined1  [16])0x0);
    uVar5 = 0xfff;
    if (n < 0xfff) {
      uVar5 = n;
    }
    uVar6 = n;
    if (0xffe < (ulong)n) {
      uVar6 = 0xfff;
    }
    uVar8 = 0;
    lVar7 = 0;
    while (auVar18 = auVar21._0_16_, (uVar6 >> 2) << 3 != uVar8) {
      uVar4 = *(ulong *)((long)in + uVar8);
      uVar8 = uVar8 + 8;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar4 >> 2 & 0x1249124912491249;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar4;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar4 >> 1;
      auVar19 = vpunpcklqdq_avx(auVar19,auVar24);
      auVar19 = vpand_avx(auVar19,auVar16);
      uVar4 = vpextrq_avx(auVar19,1);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = auVar19._0_8_;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar4;
      lVar7 = lVar7 + (SUB168(auVar3 * ZEXT816(0x1000100010001),8) +
                       SUB168(auVar3 * ZEXT816(0x1000100010001),0) & 0x3801c00e007007U);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = SUB168(auVar28 * ZEXT816(0x1000100010001),8);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = SUB168(auVar23 * ZEXT816(0x1000100010001),8);
      auVar19 = vpunpcklqdq_avx(auVar25,auVar22);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = SUB168(auVar28 * ZEXT816(0x1000100010001),0);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = SUB168(auVar23 * ZEXT816(0x1000100010001),0);
      auVar3 = vpunpcklqdq_avx(auVar27,auVar26);
      auVar19 = vpaddq_avx(auVar19,auVar3);
      auVar19 = vpand_avx(auVar19,auVar17);
      auVar18 = vpaddq_avx(auVar19,auVar18);
      auVar21 = ZEXT1664(auVar18);
    }
    auVar20 = vpermq_avx2(auVar21._0_32_,0x24);
    auVar9 = vpbroadcastq_avx512vl();
    auVar28 = vpsrlq_avx(auVar18,0x33);
    auVar3 = vpshufd_avx(auVar18,0xe8);
    auVar18 = vpshufd_avx(auVar18,0xee);
    auVar20 = vpblendd_avx2(auVar20,auVar9,0x30);
    auVar19 = vpinsrq_avx(auVar18,lVar7,1);
    auVar18 = vpand_avx(auVar3,auVar14);
    auVar23 = vpsrld_avx(auVar3,0xc);
    auVar3 = vpshufd_avx(auVar28,0xe8);
    n = n - (uVar5 & 0xffc);
    auVar20 = vpsrlvq_avx2(auVar20,auVar2);
    auVar19 = vpsrlq_avx(auVar19,0x19);
    auVar9._0_8_ = auVar23._0_8_;
    auVar9._8_8_ = auVar9._0_8_;
    auVar9._16_8_ = auVar9._0_8_;
    auVar9._24_8_ = auVar9._0_8_;
    auVar23 = vpmovqd_avx512vl(auVar20);
    auVar19 = vpshufd_avx(auVar19,0xe8);
    auVar20._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar23;
    auVar20._16_16_ = ZEXT116(1) * auVar19;
    auVar20 = vpblendd_avx2(auVar20,auVar9,0xc0);
    auVar18 = vpinsrd_avx(auVar18,(uint)lVar7 & 0xfff,2);
    auVar9 = valignd_avx512vl(ZEXT1632(auVar3),ZEXT1632(auVar3),5);
    auVar10 = vpbroadcastd_avx512vl();
    auVar20 = vpand_avx2(auVar20,auVar15);
    auVar9 = vpblendd_avx2(ZEXT1632(auVar18),auVar9,0xf8);
    auVar21 = vinserti32x8_avx512dq(ZEXT3264(auVar15),auVar10,0);
    auVar21 = vpermt2q_avx512f(ZEXT3264(auVar20),auVar11,
                               ZEXT3264(CONCAT428(auVar9._28_4_,
                                                  CONCAT424(auVar9._24_4_,
                                                            CONCAT420(auVar21._20_4_,auVar9._0_20_))
                                                 )));
    auVar12 = vpbroadcastd_avx512f();
    auVar13._56_4_ = auVar12._56_4_;
    auVar12 = vpbroadcastd_avx512f();
    auVar13._0_56_ = auVar21._0_56_;
    auVar13._60_4_ = auVar12._60_4_;
    auVar21 = vpaddd_avx512f(auVar13,*(undefined1 (*) [64])out);
    auVar21 = vmovdqu64_avx512f(auVar21);
    *(undefined1 (*) [64])out = auVar21;
    in = in + (uVar5 & 0xffc);
  }
  puVar1 = in + n;
  for (; in != puVar1; in = in + 1) {
    uVar5 = (uint)*in;
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      out[lVar7] = out[lVar7] + (uVar5 & 1);
      uVar5 = uVar5 >> 1;
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_scalar_umul128(const uint16_t* in, uint32_t n, uint32_t* out) {
    const uint64_t mask_bits = UINT64_C(0x1249124912491249); // 00000000 00000100 01110000 00010010 10001110 10110000 01101010 11110001
    const uint64_t mask_cnts = UINT64_C(0x003801C00E007007); // 00000000 00111000 00000001 11000000 00001110 00000000 01110000 00001000
    const uint64_t mask_0001 = UINT64_C(0x0001000100010001); // 00000000 00000001 00000000 00000001 00000000 00000001 00000000 00000001

    while (n >= 4) {
        uint64_t counter_a = 0; // 5 packed 12-bit counters (4 unused bits).
        uint64_t counter_b = 0;
        uint64_t counter_c = 0;
        uint64_t counter_d = 0;

        // Terminate before overflowing the counters.
        uint32_t len = ((n < 0x0FFF) ? n : 0x0FFF) & ~3;
        n -= len;
        for (const uint16_t* end = &in[len]; in != end; in += 4) {
            uint64_t v = pospopcnt_loadu_u64(in);
            uint64_t a = v & mask_bits;         // 0b0001001001001001
            uint64_t b = (v >> 1)  & mask_bits; // 0b0010010010010010 >> 1
            uint64_t c = (v >> 2)  & mask_bits; // 0b0100100100100100 >> 2
            uint64_t d = (v >> 15) & mask_0001; // 0b1000000000000000 >> 15
            uint64_t hi_a, hi_b, hi_c;
            a = pospopcnt_umul128(a, mask_0001, &hi_a);
            b = pospopcnt_umul128(b, mask_0001, &hi_b);
            c = pospopcnt_umul128(c, mask_0001, &hi_c);
            a += hi_a; // Broadcast 3-bit counts.
            b += hi_b;
            c += hi_c;
            counter_a += a & mask_cnts;
            counter_b += b & mask_cnts;
            counter_c += c & mask_cnts;
            counter_d += d;
        }

        out[0]  += counter_a & 0x0FFF;
        out[1]  += counter_b & 0x0FFF;
        out[2]  += counter_c & 0x0FFF;
        out[3]  += (counter_a >> 51);
        out[4]  += (counter_b >> 51);
        out[5]  += (counter_c >> 51);
        out[6]  += (counter_a >> 38) & 0x0FFF;
        out[7]  += (counter_b >> 38) & 0x0FFF;
        out[8]  += (counter_c >> 38) & 0x0FFF;
        out[9]  += (counter_a >> 25) & 0x0FFF;
        out[10] += (counter_b >> 25) & 0x0FFF;
        out[11] += (counter_c >> 25) & 0x0FFF;
        out[12] += (counter_a >> 12) & 0x0FFF;
        out[13] += (counter_b >> 12) & 0x0FFF;
        out[14] += (counter_c >> 12) & 0x0FFF;
        out[15] += (counter_d * mask_0001) >> 48;
    }

    // Residual words.
    for (const uint16_t* tail_end = &in[n]; in != tail_end; ++in) {
        uint16_t x = *in;
        for (int i = 0; i != 16; ++i) {
            out[i] += x & 1;
            x >>= 1;
        }
    }

    return 0;
}